

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

uint __thiscall Executor::calculateRank(Executor *this,Values *values)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint local_20;
  int a;
  uint i;
  uint rank;
  Values *values_local;
  Executor *this_local;
  
  a = 0;
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(values);
    if (sVar3 <= local_20) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (values,(ulong)local_20);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_desired,(ulong)local_20);
    iVar2 = vVar1 - *pvVar4;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    a = iVar2 + a;
    local_20 = local_20 + 1;
  }
  return a;
}

Assistant:

unsigned int Executor::calculateRank(const Values& values) const noexcept
{
    unsigned int rank = 0u;

    for (unsigned int i = 0; i < values.size(); i++)
    {
        const int a = values[i] - m_desired[i];
        rank += std::abs(a);
    }

    return rank;
}